

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_notch2_config *
ma_notch2_config_init
          (ma_notch2_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
          ma_uint32 sampleRate,double q,double frequency)

{
  if (__return_storage_ptr__ != (ma_notch2_config *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
  }
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->q = q;
  __return_storage_ptr__->frequency = frequency;
  if ((q == 0.0) && (!NAN(q))) {
    __return_storage_ptr__->q = 0.707107;
  }
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_notch2_config ma_notch2_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double q, double frequency)
{
    ma_notch2_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;
    config.q          = q;
    config.frequency  = frequency;

    if (config.q == 0) {
        config.q = 0.707107;
    }

    return config;
}